

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_acceptance.c
# Opt level: O1

REF_STATUS ref_acceptance_u_lisbon(REF_DBL x,REF_DBL y,REF_DBL *scalar)

{
  REF_STATUS RVar1;
  REF_DBL RVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = x * 1e+20;
  if (dVar4 <= -dVar4) {
    dVar4 = -dVar4;
  }
  RVar2 = y;
  if (y <= -y) {
    RVar2 = -y;
  }
  if (dVar4 <= RVar2) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c",
           0xe3,"ref_acceptance_u_lisbon","lisbon not defined for x=0");
    RVar1 = 1;
  }
  else {
    dVar3 = (y * 4.0) / x;
    dVar4 = erf(dVar3);
    dVar3 = exp(-dVar3 * dVar3);
    dVar3 = (1.0 - dVar3) * 0.14104739588693913;
    dVar4 = dVar4 * dVar4 + dVar3 * dVar3;
    if (dVar4 < 0.0) {
      RVar2 = sqrt(dVar4);
    }
    else {
      RVar2 = SQRT(dVar4);
    }
    *scalar = RVar2;
    RVar1 = 0;
  }
  return RVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_acceptance_u_lisbon(REF_DBL x, REF_DBL y,
                                                  REF_DBL *scalar) {
  REF_DBL sigma, nu, u, v;
  sigma = 4.0;
  RAS(ref_math_divisible(y, x), "lisbon not defined for x=0");
  nu = sigma * y / x;
  u = erf(nu);
  v = 1.0 / (sigma * sqrt(ref_math_pi)) * (1.0 - exp(-nu * nu));
  *scalar = sqrt(u * u + v * v);

  return REF_SUCCESS;
}